

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O0

void __thiscall
cppcms::applications_pool::applications_pool(applications_pool *this,service *srv,int param_3)

{
  int iVar1;
  _data *v;
  _data *p_Var2;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = in_RSI;
  p_Var2 = (_data *)(in_RDI + 1);
  v = (_data *)operator_new(0x60);
  (v->lock).super___recursive_mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (v->lock).super___recursive_mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(v->lock).super___recursive_mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(v->lock).super___recursive_mutex_base._M_mutex + 0x10) = 0;
  *(undefined8 *)&v->thread_count = 0;
  (v->lock).super___recursive_mutex_base._M_mutex.__align = 0;
  (v->legacy_async_apps).
  super__List_base<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  (v->legacy_async_apps).
  super__List_base<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
  ._M_impl._M_node._M_size = 0;
  (v->apps).
  super__List_base<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
  ._M_impl._M_node._M_size = 0;
  (v->legacy_async_apps).
  super__List_base<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  (v->apps).
  super__List_base<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  (v->apps).
  super__List_base<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  _data::_data(p_Var2);
  booster::hold_ptr<cppcms::applications_pool::_data>::hold_ptr
            ((hold_ptr<cppcms::applications_pool::_data> *)p_Var2,v);
  iVar1 = service::threads_no((service *)0x3aa0ea);
  p_Var2 = booster::hold_ptr<cppcms::applications_pool::_data>::operator->
                     ((hold_ptr<cppcms::applications_pool::_data> *)(in_RDI + 1));
  p_Var2->thread_count = iVar1;
  return;
}

Assistant:

applications_pool::applications_pool(service &srv,int /*unused*/) :
	srv_(&srv),
	d(new applications_pool::_data())
{
	d->thread_count = srv_->threads_no();
}